

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression *
slang::ast::NewCovergroupExpression::fromSyntax
          (Compilation *compilation,NewClassExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *in_RCX;
  EVP_PKEY_CTX *src;
  Type *args_00;
  SourceRange *in_RDI;
  SmallVector<const_slang::ast::Expression_*,_5UL> args;
  CovergroupType *coverType;
  SourceRange range;
  undefined1 in_stack_000004ef;
  ASTContext *in_stack_000004f0;
  ArgumentListSyntax *in_stack_000004f8;
  string_view in_stack_00000500;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> in_stack_00000510;
  SourceRange in_stack_000006d0;
  SmallVectorBase<const_slang::ast::Expression_*> *in_stack_000006e0;
  CovergroupType *in_stack_fffffffffffffea8;
  SourceLocation expr;
  Type *in_stack_fffffffffffffeb0;
  SourceLocation compilation_00;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  SmallVectorBase<const_slang::ast::Expression_*> local_80 [2];
  CovergroupType *local_40;
  SourceRange local_38;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *local_28;
  SourceRange *local_10;
  NewCovergroupExpression *local_8;
  
  local_28 = in_RCX;
  local_10 = in_RDI;
  local_38 = slang::syntax::SyntaxNode::sourceRange
                       ((SyntaxNode *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00))
  ;
  Type::getCanonicalType(in_stack_fffffffffffffeb0);
  local_40 = Symbol::as<slang::ast::CovergroupType>((Symbol *)0xb76499);
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0xb764ae);
  CovergroupType::getArguments(in_stack_fffffffffffffea8);
  sv((char *)in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8);
  expr = local_38.startLoc;
  compilation_00 = local_38.endLoc;
  bVar1 = CallExpression::bindArgs
                    (in_stack_000004f8,in_stack_00000510,in_stack_00000500,in_stack_000006d0,
                     in_stack_000004f0,in_stack_000006e0,(bool)in_stack_000004ef);
  if (bVar1) {
    iVar2 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      (local_80,(EVP_PKEY_CTX *)local_10,src);
    local_8 = BumpAllocator::
              emplace<slang::ast::NewCovergroupExpression,slang::ast::Type_const&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                        ((BumpAllocator *)CONCAT44(extraout_var,iVar2),args_00,local_28,local_10);
  }
  else {
    local_8 = (NewCovergroupExpression *)
              Expression::badExpr((Compilation *)compilation_00,(Expression *)expr);
  }
  SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0xb76673);
  return &local_8->super_Expression;
}

Assistant:

Expression& NewCovergroupExpression::fromSyntax(Compilation& compilation,
                                                const NewClassExpressionSyntax& syntax,
                                                const ASTContext& context,
                                                const Type& assignmentTarget) {
    auto range = syntax.sourceRange();
    auto& coverType = assignmentTarget.getCanonicalType().as<CovergroupType>();

    SmallVector<const Expression*> args;
    if (!CallExpression::bindArgs(syntax.argList, coverType.getArguments(), "new"sv, range, context,
                                  args, /* isBuiltInMethod */ false)) {
        return badExpr(compilation, nullptr);
    }

    return *compilation.emplace<NewCovergroupExpression>(assignmentTarget, args.copy(compilation),
                                                         range);
}